

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedBreakIterator::handleNext(RuleBasedBreakIterator *this)

{
  ushort uVar1;
  short key;
  uint uVar2;
  int iVar3;
  RBBIStateTable *pRVar4;
  char cVar5;
  int32_t iVar6;
  long lVar7;
  int64_t iVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  uint local_dc;
  int32_t local_d8;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  uint local_ac;
  int32_t pos;
  int16_t rule;
  int32_t lookaheadResult;
  int16_t completedRule;
  int64_t __offset;
  uint32_t tableRowLen;
  char *tableData;
  RBBIStateTable *statetable;
  int32_t initialPosition;
  int32_t result;
  LookAheadResults lookAheadMatches;
  UChar32 c;
  RBBIStateTableRow *row;
  ushort local_1e;
  RBBIRunMode mode;
  uint16_t category;
  int32_t state;
  RuleBasedBreakIterator *this_local;
  
  local_1e = 0;
  LookAheadResults::LookAheadResults((LookAheadResults *)&initialPosition);
  pRVar4 = this->fData->fForwardTable;
  uVar2 = pRVar4->fRowLen;
  this->fRuleStatusIndex = 0;
  this->fDictionaryCharCount = 0;
  iVar3 = this->fPosition;
  lVar7 = (long)iVar3 - (this->fText).chunkNativeStart;
  if (((lVar7 < 0) || ((this->fText).nativeIndexingLimit <= lVar7)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[lVar7])) {
    utext_setNativeIndex_63(&this->fText,(long)iVar3);
  }
  else {
    (this->fText).chunkOffset = (int32_t)lVar7;
  }
  if (((this->fText).chunkOffset < (this->fText).chunkLength) &&
     ((ushort)(this->fText).chunkContents[(this->fText).chunkOffset] < 0xd800)) {
    iVar10 = (this->fText).chunkOffset;
    (this->fText).chunkOffset = iVar10 + 1;
    local_ac = (uint)(ushort)(this->fText).chunkContents[iVar10];
  }
  else {
    local_ac = utext_next32_63(&this->fText);
  }
  lookAheadMatches.fKeys[4] = (undefined2)local_ac;
  lookAheadMatches.fKeys[5] = local_ac._2_2_;
  if (local_ac == 0xffffffff) {
    this->fDone = '\x01';
    return -1;
  }
  register0x00000000 = pRVar4->fTableData + uVar2;
  bVar11 = (pRVar4->fFlags & 2) != 0;
  if (bVar11) {
    local_1e = 2;
  }
  cVar5 = !bVar11;
  statetable._4_4_ = iVar3;
  do {
    if (lookAheadMatches.fKeys._8_4_ == -1) {
      if (cVar5 == '\x02') {
LAB_0034b6c9:
        if (statetable._4_4_ == iVar3) {
          utext_setNativeIndex_63(&this->fText,(long)iVar3);
          utext_next32_63(&this->fText);
          iVar8 = utext_getNativeIndex_63(&this->fText);
          statetable._4_4_ = (int)iVar8;
          this->fRuleStatusIndex = 0;
        }
        this->fPosition = statetable._4_4_;
        return statetable._4_4_;
      }
      cVar5 = '\x02';
      local_1e = 1;
    }
    if (cVar5 == '\x01') {
      uVar9 = (int)lookAheadMatches.fKeys._8_4_ >> 5;
      if ((uint)lookAheadMatches.fKeys._8_4_ < 0xd800) {
        local_bc = (uint)this->fData->fTrie->index[(int)uVar9] * 4 +
                   (lookAheadMatches.fKeys._8_4_ & 0x1f);
      }
      else {
        if ((uint)lookAheadMatches.fKeys._8_4_ < 0x10000) {
          iVar10 = 0;
          if ((int)lookAheadMatches.fKeys._8_4_ < 0xdc00) {
            iVar10 = 0x140;
          }
          local_c0 = (uint)this->fData->fTrie->index[(int)(iVar10 + uVar9)] * 4 +
                     (lookAheadMatches.fKeys._8_4_ & 0x1f);
        }
        else {
          if ((uint)lookAheadMatches.fKeys._8_4_ < 0x110000) {
            if ((int)lookAheadMatches.fKeys._8_4_ < this->fData->fTrie->highStart) {
              local_c8 = (uint)this->fData->fTrie->index
                               [(int)((uint)this->fData->fTrie->index
                                            [((int)lookAheadMatches.fKeys._8_4_ >> 0xb) + 0x820] +
                                     (uVar9 & 0x3f))] * 4 + (lookAheadMatches.fKeys._8_4_ & 0x1f);
            }
            else {
              local_c8 = this->fData->fTrie->highValueIndex;
            }
            local_c4 = local_c8;
          }
          else {
            local_c4 = this->fData->fTrie->indexLength + 0x80;
          }
          local_c0 = local_c4;
        }
        local_bc = local_c0;
      }
      local_1e = this->fData->fTrie->index[local_bc];
      if ((local_1e & 0x4000) != 0) {
        this->fDictionaryCharCount = this->fDictionaryCharCount + 1;
        local_1e = local_1e & 0xbfff;
      }
    }
    uVar1 = *(ushort *)(stack0xffffffffffffffd0 + (ulong)local_1e * 2 + 8);
    register0x00000000 = pRVar4->fTableData + uVar2 * uVar1;
    if (*(short *)register0x00000000 == -1) {
      if (cVar5 != '\0') {
        if ((this->fText).nativeIndexingLimit < (this->fText).chunkOffset) {
          iVar8 = (*((this->fText).pFuncs)->mapOffsetToNative)(&this->fText);
          local_d0 = (int)iVar8;
        }
        else {
          local_d0 = (int)(this->fText).chunkNativeStart + (this->fText).chunkOffset;
        }
        statetable._4_4_ = local_d0;
      }
      this->fRuleStatusIndex = (int)*(short *)(stack0xffffffffffffffd0 + 4);
    }
    if ((0 < *(short *)stack0xffffffffffffffd0) &&
       (iVar6 = LookAheadResults::getPosition
                          ((LookAheadResults *)&initialPosition,*(short *)stack0xffffffffffffffd0),
       -1 < iVar6)) {
      this->fRuleStatusIndex = (int)*(short *)(stack0xffffffffffffffd0 + 4);
      this->fPosition = iVar6;
      return iVar6;
    }
    key = *(short *)(stack0xffffffffffffffd0 + 2);
    if (key != 0) {
      if ((this->fText).nativeIndexingLimit < (this->fText).chunkOffset) {
        iVar8 = (*((this->fText).pFuncs)->mapOffsetToNative)(&this->fText);
        local_d8 = (int32_t)iVar8;
      }
      else {
        local_d8 = (int)(this->fText).chunkNativeStart + (this->fText).chunkOffset;
      }
      LookAheadResults::setPosition((LookAheadResults *)&initialPosition,key,local_d8);
    }
    if (uVar1 == 0) goto LAB_0034b6c9;
    if (cVar5 == '\x01') {
      if (((this->fText).chunkOffset < (this->fText).chunkLength) &&
         ((ushort)(this->fText).chunkContents[(this->fText).chunkOffset] < 0xd800)) {
        iVar10 = (this->fText).chunkOffset;
        (this->fText).chunkOffset = iVar10 + 1;
        local_dc = (uint)(ushort)(this->fText).chunkContents[iVar10];
      }
      else {
        local_dc = utext_next32_63(&this->fText);
      }
      lookAheadMatches.fKeys[4] = (undefined2)local_dc;
      lookAheadMatches.fKeys[5] = local_dc._2_2_;
    }
    else if (cVar5 == '\0') {
      cVar5 = '\x01';
    }
  } while( true );
}

Assistant:

int32_t RuleBasedBreakIterator::handleNext() {
    int32_t             state;
    uint16_t            category        = 0;
    RBBIRunMode         mode;

    RBBIStateTableRow  *row;
    UChar32             c;
    LookAheadResults    lookAheadMatches;
    int32_t             result             = 0;
    int32_t             initialPosition    = 0;
    const RBBIStateTable *statetable       = fData->fForwardTable;
    const char         *tableData          = statetable->fTableData;
    uint32_t            tableRowLen        = statetable->fRowLen;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPuts("Handle Next   pos   char  state category");
        }
    #endif

    // handleNext alway sets the break tag value.
    // Set the default for it.
    fRuleStatusIndex = 0;

    fDictionaryCharCount = 0;

    // if we're already at the end of the text, return DONE.
    initialPosition = fPosition;
    UTEXT_SETNATIVEINDEX(&fText, initialPosition);
    result          = initialPosition;
    c               = UTEXT_NEXT32(&fText);
    if (c==U_SENTINEL) {
        fDone = TRUE;
        return UBRK_DONE;
    }

    //  Set the initial state for the state machine
    state = START_STATE;
    row = (RBBIStateTableRow *)
            //(statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


    mode     = RBBI_RUN;
    if (statetable->fFlags & RBBI_BOF_REQUIRED) {
        category = 2;
        mode     = RBBI_START;
    }


    // loop until we reach the end of the text or transition to state 0
    //
    for (;;) {
        if (c == U_SENTINEL) {
            // Reached end of input string.
            if (mode == RBBI_END) {
                // We have already run the loop one last time with the
                //   character set to the psueudo {eof} value.  Now it is time
                //   to unconditionally bail out.
                break;
            }
            // Run the loop one last time with the fake end-of-input character category.
            mode = RBBI_END;
            category = 1;
        }

        //
        // Get the char category.  An incoming category of 1 or 2 means that
        //      we are preset for doing the beginning or end of input, and
        //      that we shouldn't get a category from an actual text input character.
        //
        if (mode == RBBI_RUN) {
            // look up the current character's character category, which tells us
            // which column in the state table to look at.
            // Note:  the 16 in UTRIE_GET16 refers to the size of the data being returned,
            //        not the size of the character going in, which is a UChar32.
            //
            category = UTRIE2_GET16(fData->fTrie, c);

            // Check the dictionary bit in the character's category.
            //    Counter is only used by dictionary based iteration.
            //    Chars that need to be handled by a dictionary have a flag bit set
            //    in their category values.
            //
            if ((category & 0x4000) != 0)  {
                fDictionaryCharCount++;
                //  And off the dictionary flag bit.
                category &= ~0x4000;
            }
        }

       #ifdef RBBI_DEBUG
            if (gTrace) {
                RBBIDebugPrintf("             %4" PRId64 "   ", utext_getNativeIndex(&fText));
                if (0x20<=c && c<0x7f) {
                    RBBIDebugPrintf("\"%c\"  ", c);
                } else {
                    RBBIDebugPrintf("%5x  ", c);
                }
                RBBIDebugPrintf("%3d  %3d\n", state, category);
            }
        #endif

        // State Transition - move machine to its next state
        //

        // fNextState is a variable-length array.
        U_ASSERT(category<fData->fHeader->fCatCount);
        state = row->fNextState[category];  /*Not accessing beyond memory*/
        row = (RBBIStateTableRow *)
            // (statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


        if (row->fAccepting == -1) {
            // Match found, common case.
            if (mode != RBBI_START) {
                result = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            }
            fRuleStatusIndex = row->fTagIdx;   // Remember the break status (tag) values.
        }

        int16_t completedRule = row->fAccepting;
        if (completedRule > 0) {
            // Lookahead match is completed.
            int32_t lookaheadResult = lookAheadMatches.getPosition(completedRule);
            if (lookaheadResult >= 0) {
                fRuleStatusIndex = row->fTagIdx;
                fPosition = lookaheadResult;
                return lookaheadResult;
            }
        }
        int16_t rule = row->fLookAhead;
        if (rule != 0) {
            // At the position of a '/' in a look-ahead match. Record it.
            int32_t  pos = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            lookAheadMatches.setPosition(rule, pos);
        }

        if (state == STOP_STATE) {
            // This is the normal exit from the lookup state machine.
            // We have advanced through the string until it is certain that no
            //   longer match is possible, no matter what characters follow.
            break;
        }

        // Advance to the next character.
        // If this is a beginning-of-input loop iteration, don't advance
        //    the input position.  The next iteration will be processing the
        //    first real input character.
        if (mode == RBBI_RUN) {
            c = UTEXT_NEXT32(&fText);
        } else {
            if (mode == RBBI_START) {
                mode = RBBI_RUN;
            }
        }
    }

    // The state machine is done.  Check whether it found a match...

    // If the iterator failed to advance in the match engine, force it ahead by one.
    //   (This really indicates a defect in the break rules.  They should always match
    //    at least one character.)
    if (result == initialPosition) {
        utext_setNativeIndex(&fText, initialPosition);
        utext_next32(&fText);
        result = (int32_t)utext_getNativeIndex(&fText);
        fRuleStatusIndex = 0;
    }

    // Leave the iterator at our result position.
    fPosition = result;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPrintf("result = %d\n\n", result);
        }
    #endif
    return result;
}